

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileLibraryTargetGenerator::WriteStaticLibraryRules(cmMakefileLibraryTargetGenerator *this)

{
  string *config;
  cmMakefile *this_00;
  cmLocalUnixMakefileGenerator3 *this_01;
  bool bVar1;
  char *pcVar2;
  string extraFlags;
  string linkRuleVar;
  string linkLanguage;
  allocator local_99;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  config = &(this->super_cmMakefileTargetGenerator).ConfigName;
  cmTarget::GetLinkerLanguage(&local_38,(this->super_cmMakefileTargetGenerator).Target,config);
  std::__cxx11::string::string((string *)&local_58,"CMAKE_",(allocator *)&local_98);
  std::__cxx11::string::append((string *)&local_58);
  std::__cxx11::string::append((char *)&local_58);
  std::__cxx11::string::string((string *)&local_98,"INTERPROCEDURAL_OPTIMIZATION",&local_99);
  bVar1 = cmMakefileTargetGenerator::GetFeatureAsBool
                    (&this->super_cmMakefileTargetGenerator,&local_98);
  if (bVar1) {
    this_00 = (this->super_cmMakefileTargetGenerator).Makefile;
    std::operator+(&local_78,&local_58,"_IPO");
    pcVar2 = cmMakefile::GetDefinition(this_00,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    if (pcVar2 != (char *)0x0) {
      std::__cxx11::string::append((char *)&local_58);
    }
  }
  else {
    std::__cxx11::string::~string((string *)&local_98);
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  this_01 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmsys::SystemTools::UpperCase(&local_78,config);
  cmLocalGenerator::GetStaticLibraryFlags
            (&this_01->super_cmLocalGenerator,&local_98,&local_78,
             (this->super_cmMakefileTargetGenerator).Target);
  std::__cxx11::string::~string((string *)&local_78);
  WriteLibraryRules(this,&local_58,&local_98,false);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteStaticLibraryRules()
{
  std::string linkLanguage =
    this->Target->GetLinkerLanguage(this->ConfigName);
  std::string linkRuleVar = "CMAKE_";
  linkRuleVar += linkLanguage;
  linkRuleVar += "_CREATE_STATIC_LIBRARY";

  if(this->GetFeatureAsBool("INTERPROCEDURAL_OPTIMIZATION") &&
     this->Makefile->GetDefinition(linkRuleVar+"_IPO"))
    {
    linkRuleVar += "_IPO";
    }

  std::string extraFlags;
  this->LocalGenerator->GetStaticLibraryFlags(extraFlags,
    cmSystemTools::UpperCase(this->ConfigName), this->Target);
  this->WriteLibraryRules(linkRuleVar, extraFlags, false);
}